

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passpredict.cc
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  void *this;
  pointer pPVar3;
  pointer dt2;
  _Self *__x;
  double dVar4;
  string local_688 [32];
  iterator local_668;
  _List_const_iterator<PassDetails> local_660;
  TimeSpan local_658;
  int local_64c;
  iterator local_648;
  _List_const_iterator<PassDetails> local_640;
  const_iterator itr;
  stringstream local_630 [8];
  stringstream ss;
  ostream local_620 [376];
  _Self local_4a8;
  _Self local_4a0;
  list<PassDetails,_std::allocator<PassDetails>_> local_498;
  undefined1 local_480 [8];
  list<PassDetails,_std::allocator<PassDetails>_> pass_list;
  DateTime end_date;
  DateTime start_date;
  SGP4 sgp4;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_121;
  string local_120;
  undefined1 local_100 [8];
  Tle tle;
  CoordGeodetic geo;
  
  libsgp4::CoordGeodetic::CoordGeodetic
            ((CoordGeodetic *)&tle.norad_number_,51.507406923983446,-0.12773752212524414,0.05,false)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"GALILEO-PFM (GSAT0101)  ",&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,
             "1 37846U 11060A   12293.53312491  .00000049  00000-0  00000-0 0  1435",&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,
             "2 37846  54.7963 119.5777 0000994 319.0618  40.9779  1.70474628  6204",
             (allocator<char> *)&sgp4.field_0x2cf);
  libsgp4::Tle::Tle((Tle *)local_100,&local_120,&local_158,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&sgp4.field_0x2cf);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  libsgp4::SGP4::SGP4((SGP4 *)&start_date,(Tle *)local_100);
  poVar2 = libsgp4::operator<<((ostream *)&std::cout,(Tle *)local_100);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  end_date = libsgp4::DateTime::Now(true);
  pass_list.super__List_base<PassDetails,_std::allocator<PassDetails>_>._M_impl._M_node._M_size =
       (size_t)libsgp4::DateTime::AddDays(&end_date,7.0);
  std::__cxx11::list<PassDetails,_std::allocator<PassDetails>_>::list
            ((list<PassDetails,_std::allocator<PassDetails>_> *)local_480);
  poVar2 = std::operator<<((ostream *)&std::cout,"Start time: ");
  poVar2 = libsgp4::operator<<(poVar2,&end_date);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"End time  : ");
  poVar2 = libsgp4::operator<<(poVar2,(DateTime *)
                                      &pass_list.
                                       super__List_base<PassDetails,_std::allocator<PassDetails>_>.
                                       _M_impl._M_node._M_size);
  this = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  GeneratePassList_abi_cxx11_
            (&local_498,(CoordGeodetic *)&tle.norad_number_,(SGP4 *)&start_date,&end_date,
             (DateTime *)
             &pass_list.super__List_base<PassDetails,_std::allocator<PassDetails>_>._M_impl._M_node.
              _M_size,0xb4);
  std::__cxx11::list<PassDetails,_std::allocator<PassDetails>_>::operator=
            ((list<PassDetails,_std::allocator<PassDetails>_> *)local_480,&local_498);
  std::__cxx11::list<PassDetails,_std::allocator<PassDetails>_>::~list(&local_498);
  local_4a0._M_node =
       (_List_node_base *)
       std::__cxx11::list<PassDetails,_std::allocator<PassDetails>_>::begin
                 ((list<PassDetails,_std::allocator<PassDetails>_> *)local_480);
  local_4a8._M_node =
       (_List_node_base *)
       std::__cxx11::list<PassDetails,_std::allocator<PassDetails>_>::end
                 ((list<PassDetails,_std::allocator<PassDetails>_> *)local_480);
  bVar1 = std::operator==(&local_4a0,&local_4a8);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"No passes found");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_630);
    poVar2 = (ostream *)std::ostream::operator<<(local_620,std::right);
    itr._M_node._4_4_ = std::setprecision(1);
    poVar2 = std::operator<<(poVar2,itr._M_node._4_4_);
    std::ostream::operator<<(poVar2,std::fixed);
    local_648._M_node =
         (_List_node_base *)
         std::__cxx11::list<PassDetails,_std::allocator<PassDetails>_>::begin
                   ((list<PassDetails,_std::allocator<PassDetails>_> *)local_480);
    std::_List_const_iterator<PassDetails>::_List_const_iterator(&local_640,&local_648);
    do {
      poVar2 = std::operator<<(local_620,"AOS: ");
      pPVar3 = std::_List_const_iterator<PassDetails>::operator->(&local_640);
      poVar2 = libsgp4::operator<<(poVar2,&pPVar3->aos);
      poVar2 = std::operator<<(poVar2,", LOS: ");
      pPVar3 = std::_List_const_iterator<PassDetails>::operator->(&local_640);
      poVar2 = libsgp4::operator<<(poVar2,&pPVar3->los);
      poVar2 = std::operator<<(poVar2,", Max El: ");
      local_64c = (int)std::setw(4);
      poVar2 = std::operator<<(poVar2,(_Setw)local_64c);
      pPVar3 = std::_List_const_iterator<PassDetails>::operator->(&local_640);
      dVar4 = libsgp4::Util::RadiansToDegrees(pPVar3->max_elevation);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar4);
      poVar2 = std::operator<<(poVar2,", Duration: ");
      pPVar3 = std::_List_const_iterator<PassDetails>::operator->(&local_640);
      dt2 = std::_List_const_iterator<PassDetails>::operator->(&local_640);
      local_658 = libsgp4::operator-(&pPVar3->los,&dt2->aos);
      poVar2 = libsgp4::operator<<(poVar2,&local_658);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      __x = std::_List_const_iterator<PassDetails>::operator++(&local_640);
      local_668._M_node =
           (_List_node_base *)
           std::__cxx11::list<PassDetails,_std::allocator<PassDetails>_>::end
                     ((list<PassDetails,_std::allocator<PassDetails>_> *)local_480);
      std::_List_const_iterator<PassDetails>::_List_const_iterator(&local_660,&local_668);
      bVar1 = std::operator!=(__x,&local_660);
    } while (bVar1);
    std::__cxx11::stringstream::str();
    std::operator<<((ostream *)&std::cout,local_688);
    std::__cxx11::string::~string(local_688);
    std::__cxx11::stringstream::~stringstream(local_630);
  }
  std::__cxx11::list<PassDetails,_std::allocator<PassDetails>_>::~list
            ((list<PassDetails,_std::allocator<PassDetails>_> *)local_480);
  libsgp4::Tle::~Tle((Tle *)local_100);
  return 0;
}

Assistant:

int main()
{
    libsgp4::CoordGeodetic geo(51.507406923983446, -0.12773752212524414, 0.05);
    libsgp4::Tle tle("GALILEO-PFM (GSAT0101)  ",
        "1 37846U 11060A   12293.53312491  .00000049  00000-0  00000-0 0  1435",
        "2 37846  54.7963 119.5777 0000994 319.0618  40.9779  1.70474628  6204");
    libsgp4::SGP4 sgp4(tle);

    std::cout << tle << std::endl;

    /*
     * generate 7 day schedule
     */
    libsgp4::DateTime start_date = libsgp4::DateTime::Now(true);
    libsgp4::DateTime end_date(start_date.AddDays(7.0));

    std::list<struct PassDetails> pass_list;

    std::cout << "Start time: " << start_date << std::endl;
    std::cout << "End time  : " << end_date << std::endl << std::endl;

    /*
     * generate passes
     */
    pass_list = GeneratePassList(geo, sgp4, start_date, end_date, 180);

    if (pass_list.begin() == pass_list.end())
    {
        std::cout << "No passes found" << std::endl;
    }
    else
    {
        std::stringstream ss;

        ss << std::right << std::setprecision(1) << std::fixed;

        std::list<struct PassDetails>::const_iterator itr = pass_list.begin();
        do
        {
            ss  << "AOS: " << itr->aos
                << ", LOS: " << itr->los
                << ", Max El: " << std::setw(4) << libsgp4::Util::RadiansToDegrees(itr->max_elevation)
                << ", Duration: " << (itr->los - itr->aos)
                << std::endl;
        }
        while (++itr != pass_list.end());

        std::cout << ss.str();
    }

    return 0;
}